

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O2

QBitArray * performBitwiseOperationInPlace<std::bit_xor<unsigned_char>>(QBitArray *self,long other)

{
  char *pcVar1;
  char *pcVar2;
  QBitArray *pQVar3;
  long size;
  
  pcVar1 = (self->d).d.ptr;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = &QByteArray::_empty;
  }
  pcVar2 = *(char **)(other + 8);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = &QByteArray::_empty;
  }
  size = *(long *)(other + 0x10) * 8 - (long)*pcVar2;
  if ((self->d).d.size * 8 - (long)*pcVar1 < size) {
    QBitArray::resize(self,size);
  }
  pQVar3 = performBitwiseOperationHelper<std::bit_xor<unsigned_char>>(self,self,other);
  return pQVar3;
}

Assistant:

Q_NEVER_INLINE static
QBitArray &performBitwiseOperationInPlace(QBitArray &self, const QBitArray &other, BitwiseOp op)
{
    if (self.size() < other.size())
        self.resize(other.size());
    return performBitwiseOperationHelper(self, self, other, op);
}